

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::CompactMemTable(DBImpl *this)

{
  Version *this_00;
  undefined1 auVar1 [8];
  Status s;
  VersionEdit edit;
  undefined1 local_f8 [8];
  undefined1 local_f0 [40];
  undefined1 local_c8 [66];
  bool local_86;
  
  if (this->imm_ == (MemTable *)0x0) {
    __assert_fail("imm_ != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x222,"void leveldb::DBImpl::CompactMemTable()");
  }
  VersionEdit::VersionEdit((VersionEdit *)local_c8);
  this_00 = this->versions_->current_;
  Version::Ref(this_00);
  WriteLevel0Table((DBImpl *)local_f8,(MemTable *)this,(VersionEdit *)this->imm_,(Version *)local_c8
                  );
  Version::Unref(this_00);
  if (local_f8 == (undefined1  [8])0x0) {
    if (((this->shutting_down_)._M_base._M_i & 1U) != 0) {
      local_f0._0_8_ = "Deleting DB during memtable compaction";
      local_f0._8_8_ = (_func_int **)0x26;
      local_f0._24_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
      local_f0._32_8_ = (FilterPolicy *)0x0;
      Status::IOError((Status *)(local_f0 + 0x10),(Slice *)local_f0,(Slice *)(local_f0 + 0x18));
      auVar1 = local_f8;
      local_f8 = (undefined1  [8])local_f0._16_8_;
      local_f0._16_8_ = auVar1;
      Status::~Status((Status *)(local_f0 + 0x10));
    }
    if (local_f8 == (undefined1  [8])0x0) {
      local_86 = true;
      local_c8._40_8_ = (pointer)0x0;
      local_c8._32_8_ = this->logfile_number_;
      local_c8[0x41] = true;
      VersionSet::LogAndApply
                ((VersionSet *)local_f0,(VersionEdit *)this->versions_,(Mutex *)local_c8);
      auVar1 = local_f8;
      local_f8 = (undefined1  [8])local_f0._0_8_;
      local_f0._0_8_ = auVar1;
      Status::~Status((Status *)local_f0);
      if (local_f8 == (undefined1  [8])0x0) {
        MemTable::Unref(this->imm_);
        this->imm_ = (MemTable *)0x0;
        (this->has_imm_)._M_base._M_i = false;
        RemoveObsoleteFiles(this);
        goto LAB_00111255;
      }
    }
  }
  RecordBackgroundError(this,(Status *)local_f8);
LAB_00111255:
  Status::~Status((Status *)local_f8);
  VersionEdit::~VersionEdit((VersionEdit *)local_c8);
  return;
}

Assistant:

void DBImpl::CompactMemTable() {
  mutex_.AssertHeld();
  assert(imm_ != nullptr);

  // Save the contents of the memtable as a new Table
  VersionEdit edit;
  Version* base = versions_->current();
  base->Ref();
  Status s = WriteLevel0Table(imm_, &edit, base);
  base->Unref();

  if (s.ok() && shutting_down_.load(std::memory_order_acquire)) {
    s = Status::IOError("Deleting DB during memtable compaction");
  }

  // Replace immutable memtable with the generated Table
  if (s.ok()) {
    edit.SetPrevLogNumber(0);
    edit.SetLogNumber(logfile_number_);  // Earlier logs no longer needed
    s = versions_->LogAndApply(&edit, &mutex_);
  }

  if (s.ok()) {
    // Commit to the new state
    imm_->Unref();
    imm_ = nullptr;
    has_imm_.store(false, std::memory_order_release);
    RemoveObsoleteFiles();
  } else {
    RecordBackgroundError(s);
  }
}